

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

string * __thiscall Chainstate::ToString_abi_cxx11_(string *__return_storage_ptr__,Chainstate *this)

{
  pointer ppCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  CBlockIndex *this_00;
  long in_FS_OFFSET;
  allocator<char> local_6d;
  int local_6c;
  char *local_68;
  base_blob<256u> local_60 [32];
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar1 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this_00 = (CBlockIndex *)0x0;
  }
  else {
    this_00 = ppCVar1[-1];
  }
  local_68 = "ibd";
  if ((this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_engaged != false) {
    local_68 = "snapshot";
  }
  if (this_00 == (CBlockIndex *)0x0) {
    local_6c = -1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"null",&local_6d);
  }
  else {
    local_6c = this_00->nHeight;
    CBlockIndex::GetBlockHash((uint256 *)local_60,this_00);
    base_blob<256u>::ToString_abi_cxx11_(&local_40,local_60);
  }
  tinyformat::format<char_const*,int,std::__cxx11::string>
            (__return_storage_ptr__,(tinyformat *)"Chainstate [%s] @ height %d (%s)",
             (char *)&local_68,(char **)&local_6c,(int *)&local_40,in_R9);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string Chainstate::ToString()
{
    AssertLockHeld(::cs_main);
    CBlockIndex* tip = m_chain.Tip();
    return strprintf("Chainstate [%s] @ height %d (%s)",
                     m_from_snapshot_blockhash ? "snapshot" : "ibd",
                     tip ? tip->nHeight : -1, tip ? tip->GetBlockHash().ToString() : "null");
}